

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

ActivationSoftsign * __thiscall
CoreML::Specification::ActivationSoftsign::New(ActivationSoftsign *this,Arena *arena)

{
  ActivationSoftsign *this_00;
  ActivationSoftsign *n;
  Arena *arena_local;
  ActivationSoftsign *this_local;
  
  this_00 = (ActivationSoftsign *)operator_new(0x18);
  ActivationSoftsign(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationSoftsign>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationSoftsign* ActivationSoftsign::New(::google::protobuf::Arena* arena) const {
  ActivationSoftsign* n = new ActivationSoftsign;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}